

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::TryUseFixedAccessor
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          PropertyRecord *propertyRecord,Var *pAccessor,FixedPropertyKind propertyType,bool getter,
          ScriptContext *requestContext)

{
  bool bVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,FixedMethodsPhase);
  if ((((!bVar1) || (DAT_0145948a == '\0')) &&
      ((bVar1 = Phases::IsEnabled((Phases *)&DAT_014594b0,FixedMethodsPhase), !bVar1 ||
       (DAT_0145948a == '\0')))) &&
     ((bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,UseFixedDataPropsPhase), !bVar1 ||
      (DAT_0145948a == '\0')))) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_014594b0,UseFixedDataPropsPhase);
    if (!bVar1) {
      return false;
    }
    if (DAT_0145948a != '\x01') {
      return false;
    }
  }
  Output::Print(L"FixedFields: attempt to use fixed accessor %s from SimpleDictionaryTypeHandler returned false.\n"
                ,propertyRecord + 1);
  if (((this->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     (pRVar2 = GetSingletonInstance(this),
     *(ScriptContext **)
      (*(long *)(*(long *)((pRVar2->super_RecyclerWeakReferenceBase).strongRef + 8) + 8) + 0x490) !=
     requestContext)) {
    Output::Print(L"FixedFields: Cross Site Script Context is used for property %s. \n",
                  propertyRecord + 1);
  }
  Output::Flush();
  return false;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryUseFixedAccessor(PropertyRecord const * propertyRecord, Var * pAccessor, FixedPropertyKind propertyType, bool getter, ScriptContext * requestContext)
    {
        if (PHASE_VERBOSE_TRACE1(Js::FixedMethodsPhase) || PHASE_VERBOSE_TESTTRACE1(Js::FixedMethodsPhase) ||
            PHASE_VERBOSE_TRACE1(Js::UseFixedDataPropsPhase) || PHASE_VERBOSE_TESTTRACE1(Js::UseFixedDataPropsPhase))
        {
            Output::Print(_u("FixedFields: attempt to use fixed accessor %s from SimpleDictionaryTypeHandler returned false.\n"), propertyRecord->GetBuffer());
            if (this->HasSingletonInstance() && this->GetSingletonInstance()->Get()->GetScriptContext() != requestContext)
            {
                Output::Print(_u("FixedFields: Cross Site Script Context is used for property %s. \n"), propertyRecord->GetBuffer());
            }
            Output::Flush();
        }
        return false;
    }